

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool prvTidyTidyMetaCharset(TidyDocImpl *doc)

{
  ulong uVar1;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var2;
  TidyAllocator *pTVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ctmbstr str;
  Node *element;
  AttVal *pAVar8;
  AttVal *pAVar9;
  tmbstr ptVar10;
  Node *pNVar11;
  Node *local_e0;
  Bool add_meta;
  tmbstr newValue;
  TidyBuffer charsetString;
  TidyBuffer buf;
  Node *prevNode;
  Node *metaTag;
  Node *head;
  Node *currentNode;
  ctmbstr enc;
  uint outenc;
  Bool charsetFound;
  AttVal *httpEquivAttr;
  AttVal *contentAttr;
  AttVal *charsetAttr;
  TidyDocImpl *doc_local;
  
  bVar4 = false;
  uVar6 = (uint)(doc->config).value[0x3c].v;
  str = prvTidyGetEncodingNameFromTidyId(uVar6);
  element = prvTidyFindHEAD(doc);
  uVar1 = (doc->config).value[0x35].v;
  if (((element == (Node *)0x0) || (str == (ctmbstr)0x0)) ||
     (uVar5 = prvTidytmbstrlen(str), uVar5 == 0)) {
    doc_local._4_4_ = no;
  }
  else if (uVar6 == 0) {
    doc_local._4_4_ = no;
  }
  else if (uVar6 == 5) {
    doc_local._4_4_ = no;
  }
  else if ((int)(doc->config).value[6].v == 1) {
    doc_local._4_4_ = no;
  }
  else {
    tidyBufInit((TidyBuffer *)&newValue);
    tidyBufClear((TidyBuffer *)&newValue);
    tidyBufAppend((TidyBuffer *)&newValue,"charset=",8);
    uVar6 = prvTidytmbstrlen(str);
    tidyBufAppend((TidyBuffer *)&newValue,str,uVar6);
    tidyBufAppend((TidyBuffer *)&newValue,"",1);
    head = element->content;
    while (head != (Node *)0x0) {
      if (((head != (Node *)0x0) && (head->tag != (Dict *)0x0)) && (head->tag->id == TidyTag_META))
      {
        pAVar8 = prvTidyAttrGetById(head,TidyAttr_CHARSET);
        pAVar9 = prvTidyAttrGetById(head,TidyAttr_HTTP_EQUIV);
        if ((pAVar8 != (AttVal *)0x0) || (pAVar9 != (AttVal *)0x0)) {
          if ((pAVar8 == (AttVal *)0x0) || (pAVar9 != (AttVal *)0x0)) {
            if ((pAVar9 == (AttVal *)0x0) || (pAVar8 != (AttVal *)0x0)) {
              if ((pAVar9 != (AttVal *)0x0) && (pAVar8 != (AttVal *)0x0)) {
                pNVar11 = head->prev;
                prvTidyReport(doc,element,head,0x235);
                prvTidyDiscardElement(doc,head);
                head = pNVar11;
              }
            }
            else {
              pAVar8 = prvTidyAttrGetById(head,TidyAttr_CONTENT);
              if (pAVar8 != (AttVal *)0x0) {
                if (pAVar9->value == (tmbstr)0x0) {
                  pNVar11 = head->prev;
                  prvTidyReport(doc,element,head,0x235);
                  prvTidyDiscardElement(doc,head);
                  head = pNVar11;
                }
                else {
                  iVar7 = prvTidytmbstrcasecmp(pAVar9->value,"content-type");
                  if ((iVar7 == 0) && (pAVar8->value != (tmbstr)0x0)) {
                    iVar7 = prvTidytmbstrcasecmp(pAVar8->value,(ctmbstr)charsetString.allocator);
                    if (iVar7 == 0) {
                      if (bVar4) {
                        pNVar11 = head->prev;
                        prvTidyReport(doc,element,head,0x235);
                        prvTidyDiscardElement(doc,head);
                        head = pNVar11;
                      }
                      else {
                        bVar4 = true;
                      }
                    }
                    else if (bVar4) {
                      pNVar11 = head->prev;
                      prvTidyReport(doc,element,head,0x235);
                      prvTidyDiscardElement(doc,head);
                      head = pNVar11;
                    }
                    else {
                      p_Var2 = doc->allocator->vtbl->alloc;
                      pTVar3 = doc->allocator;
                      uVar6 = prvTidytmbstrlen(str);
                      ptVar10 = (tmbstr)(*p_Var2)(pTVar3,(long)uVar6 + 0x14);
                      prvTidytmbstrcpy(ptVar10,"text/html; charset=");
                      prvTidytmbstrcpy(ptVar10 + 0x13,str);
                      if ((int)(doc->config).value[0x4d].v != 0) {
                        prvTidyReportAttrError(doc,head,pAVar8,0x228);
                      }
                      (*doc->allocator->vtbl->free)(doc->allocator,pAVar8->value);
                      pAVar8->value = ptVar10;
                      bVar4 = true;
                    }
                  }
                }
              }
            }
          }
          else if ((bVar4) || (pAVar8->value == (tmbstr)0x0)) {
            pNVar11 = head->prev;
            prvTidyReport(doc,element,head,0x235);
            prvTidyDiscardElement(doc,head);
            head = pNVar11;
          }
          else {
            bVar4 = true;
            iVar7 = prvTidytmbstrcasecmp(pAVar8->value,str);
            if (iVar7 != 0) {
              p_Var2 = doc->allocator->vtbl->alloc;
              pTVar3 = doc->allocator;
              uVar6 = prvTidytmbstrlen(str);
              ptVar10 = (tmbstr)(*p_Var2)(pTVar3,(long)uVar6 + 1);
              prvTidytmbstrcpy(ptVar10,str);
              prvTidyReportAttrError(doc,head,pAVar8,0x228);
              (*doc->allocator->vtbl->free)(doc->allocator,pAVar8->value);
              pAVar8->value = ptVar10;
            }
            if (head != element->content->next) {
              prvTidyRemoveNode(head);
              prvTidyInsertNodeAtStart(element,head);
            }
          }
        }
      }
      if (head == (Node *)0x0) {
        local_e0 = (Node *)0x0;
      }
      else {
        local_e0 = head->next;
      }
      head = local_e0;
    }
    if (((int)uVar1 != 0) && (!bVar4)) {
      pNVar11 = prvTidyInferredTag(doc,TidyTag_META);
      iVar7 = prvTidyHTMLVersion(doc);
      if ((iVar7 == 0x20000) || (iVar7 == 0x40000)) {
        prvTidyAddAttribute(doc,pNVar11,"charset",str);
      }
      else {
        tidyBufInit((TidyBuffer *)&charsetString.next);
        tidyBufAppend((TidyBuffer *)&charsetString.next,"text/html; ",0xb);
        uVar6 = prvTidytmbstrlen((ctmbstr)charsetString.allocator);
        tidyBufAppend((TidyBuffer *)&charsetString.next,charsetString.allocator,uVar6);
        tidyBufAppend((TidyBuffer *)&charsetString.next,"",1);
        prvTidyAddAttribute(doc,pNVar11,"http-equiv","Content-Type");
        prvTidyAddAttribute(doc,pNVar11,"content",(ctmbstr)buf.allocator);
        tidyBufFree((TidyBuffer *)&charsetString.next);
      }
      prvTidyInsertNodeAtStart(element,pNVar11);
      prvTidyReport(doc,pNVar11,element,0x222);
    }
    tidyBufFree((TidyBuffer *)&newValue);
    doc_local._4_4_ = yes;
  }
  return doc_local._4_4_;
}

Assistant:

Bool TY_(TidyMetaCharset)(TidyDocImpl* doc)
{
    AttVal *charsetAttr;
    AttVal *contentAttr;
    AttVal *httpEquivAttr;
    Bool charsetFound = no;
    uint outenc = cfg(doc, TidyOutCharEncoding);
    ctmbstr enc = TY_(GetEncodingNameFromTidyId)(outenc);
    Node *currentNode;
    Node *head = TY_(FindHEAD)(doc);
    Node *metaTag;
    Node *prevNode;
    TidyBuffer buf;
    TidyBuffer charsetString;
    /* tmbstr httpEquivAttrValue; */
    /* tmbstr lcontent; */
    tmbstr newValue;
    Bool add_meta = cfgBool(doc, TidyMetaCharset);

    /* We can't do anything we don't have a head or encoding is NULL */
    if (!head || !enc || !TY_(tmbstrlen)(enc))
        return no;
    if (outenc == RAW)
        return no;
#ifndef NO_NATIVE_ISO2022_SUPPORT
    if (outenc == ISO2022)
        return no;
#endif
    if (cfgAutoBool(doc, TidyBodyOnly) == TidyYesState)
        return no; /* nothing to do here if showing body only */

    tidyBufInit(&charsetString);
    /* Set up the content test 'charset=value' */
    tidyBufClear(&charsetString);
    tidyBufAppend(&charsetString, "charset=", 8);
    tidyBufAppend(&charsetString, (char*)enc, TY_(tmbstrlen)(enc));
    tidyBufAppend(&charsetString, "\0", 1); /* zero terminate the buffer */
    /* process the children of the head */
    /* Issue #656 - guard against 'currentNode' being set NULL in loop */
    for (currentNode = head->content; currentNode; 
        currentNode = (currentNode ? currentNode->next : NULL))
    {
        if (!nodeIsMETA(currentNode))
            continue;   /* not a meta node */
        charsetAttr = attrGetCHARSET(currentNode);
        httpEquivAttr = attrGetHTTP_EQUIV(currentNode);
        if (!charsetAttr && !httpEquivAttr)
            continue;   /* has no charset attribute */
                        /*
                        Meta charset comes in quite a few flavors:
                        1. <meta charset="value"> - expected for (X)HTML5.
                        */
        if (charsetAttr && !httpEquivAttr)
        {
            /* we already found one, so remove the rest. */
            if (charsetFound || !charsetAttr->value)
            {
                prevNode = currentNode->prev;
                TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                TY_(DiscardElement)(doc, currentNode);
                currentNode = prevNode;
                continue;
            }
            charsetFound = yes;
            /* Fix mismatched attribute value */
            if (TY_(tmbstrcasecmp)(charsetAttr->value, enc) != 0)
            {
                newValue = (tmbstr)TidyDocAlloc(doc, TY_(tmbstrlen)(enc) + 1);   /* allocate + 1 for 0 */
                TY_(tmbstrcpy)(newValue, enc);
                /* Note: previously http-equiv had been modified, without warning
                in void TY_(VerifyHTTPEquiv)(TidyDocImpl* doc, Node *head)
                */
                TY_(ReportAttrError)(doc, currentNode, charsetAttr, ATTRIBUTE_VALUE_REPLACED);
                TidyDocFree(doc, charsetAttr->value);   /* free current value */
                charsetAttr->value = newValue;
            }
            /* Make sure it's the first element. */
            if (currentNode != head->content->next) {
                TY_(RemoveNode)(currentNode);
                TY_(InsertNodeAtStart)(head, currentNode);
            }
            continue;
        }
        /*
        2. <meta http-equiv="content-type" content="text/html; charset=UTF-8">
        expected for HTML4. This is normally ok - but can clash.
        */
        if (httpEquivAttr && !charsetAttr)
        {
            contentAttr = TY_(AttrGetById)(currentNode, TidyAttr_CONTENT);
            if (!contentAttr)
                continue;   /* has no 'content' attribute */
            if (!httpEquivAttr->value)
            {
                prevNode = currentNode->prev;
                TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                TY_(DiscardElement)(doc, currentNode);
                currentNode = prevNode;
                continue;
            }
            /* httpEquivAttrValue = TY_(tmbstrtolower)(httpEquivAttr->value); */
            if (TY_(tmbstrcasecmp)(httpEquivAttr->value, (tmbstr) "content-type") != 0)
                continue;   /* is not 'content-type' */
            if (!contentAttr->value)
            {
                continue; /* has no 'content' attribute has NO VALUE! */
            }
            /* check encoding matches
            If a miss-match found here, fix it. previous silently done
            in void TY_(VerifyHTTPEquiv)(TidyDocImpl* doc, Node *head)
            lcontent = TY_(tmbstrtolower)(contentAttr->value);
            */
            if (TY_(tmbstrcasecmp)(contentAttr->value, (ctmbstr)charsetString.bp) == 0)
            {
                /* we already found one, so remove the rest. */
                if (charsetFound)
                {
                    prevNode = currentNode->prev;
                    TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                    TY_(DiscardElement)(doc, currentNode);
                    currentNode = prevNode;
                    continue;
                }
                charsetFound = yes;
            }
            else
            {
                /* fix a mis-match */
                if (charsetFound)
                {
                    prevNode = currentNode->prev;
                    TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
                    TY_(DiscardElement)(doc, currentNode);
                    currentNode = prevNode;
                }
                else
                {
                    /* correct the content */
                    newValue = (tmbstr)TidyDocAlloc(doc, 19 + TY_(tmbstrlen)(enc) + 1);
                    TY_(tmbstrcpy)(newValue, "text/html; charset=");
                    TY_(tmbstrcpy)(newValue + 19, enc);
                    if (cfgBool(doc, TidyShowMetaChange))   /* Issue #456 - backward compatibility only */
                        TY_(ReportAttrError)(doc, currentNode, contentAttr, ATTRIBUTE_VALUE_REPLACED);
                    TidyDocFree(doc, contentAttr->value);
                    contentAttr->value = newValue;
                    charsetFound = yes;
                }
            }
            continue;
        }
        /*
        3. <meta charset="utf-8" http-equiv="Content-Type" content="...">
        This is generally bad. Discard and warn.
        */
        if (httpEquivAttr && charsetAttr)
        {
            /* printf("WARN ABOUT HTTP EQUIV AND CHARSET ATTR! \n"); */
            prevNode = currentNode->prev;
            TY_(Report)(doc, head, currentNode, DISCARDING_UNEXPECTED);
            TY_(DiscardElement)(doc, currentNode);
            currentNode = prevNode;
        }
    }

    /* completed head scan - add appropriate meta - if 'yes' and none exists */
    if (add_meta && !charsetFound)
    {
        /* add appropriate meta charset tag - no warning */
        metaTag = TY_(InferredTag)(doc, TidyTag_META);
        switch (TY_(HTMLVersion)(doc))
        {
        case HT50:
        case XH50:
            TY_(AddAttribute)(doc, metaTag, "charset", enc);
            break;
        default:
            tidyBufInit(&buf);
            tidyBufAppend(&buf, "text/html; ", 11);
            tidyBufAppend(&buf, charsetString.bp, TY_(tmbstrlen)((ctmbstr)charsetString.bp));
            tidyBufAppend(&buf, "\0", 1);   /* zero terminate the buffer */
            TY_(AddAttribute)(doc, metaTag, "http-equiv", "Content-Type"); /* add 'http-equiv' const. */
            TY_(AddAttribute)(doc, metaTag, "content", (char*)buf.bp);  /* add 'content="<enc>"' */
            tidyBufFree(&buf);
        }
        TY_(InsertNodeAtStart)(head, metaTag);
        TY_(Report)(doc, metaTag, head, ADDED_MISSING_CHARSET); /* actually just 'Info:' */
    }
    tidyBufFree(&charsetString);
    return yes;
}